

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NameSyntax&>
          (BumpAllocator *this,NameSyntax *args)

{
  NamedTypeSyntax *pNVar1;
  NameSyntax *in_RDI;
  NamedTypeSyntax *unaff_retaddr;
  
  pNVar1 = (NamedTypeSyntax *)allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  slang::syntax::NamedTypeSyntax::NamedTypeSyntax(unaff_retaddr,in_RDI);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }